

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  pdVar10 = &pFVar6->defaultVal;
  if ((pFVar6->dx_).num_elts != 0) {
    pdVar10 = (pFVar6->dx_).ptr_to_data + i;
  }
  dVar1 = (pFVar5->fadexpr_).left_.constant_;
  pFVar7 = (pFVar4->fadexpr_).right_;
  pdVar11 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar11 = (pFVar7->dx_).ptr_to_data + i;
  }
  dVar2 = (pFVar4->fadexpr_).left_.constant_;
  pFVar8 = (this->right_->fadexpr_).right_;
  pdVar9 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar9 = (pFVar8->dx_).ptr_to_data + i;
  }
  return (((pFVar3->fadexpr_).left_.constant_ - dVar1 * pFVar6->val_) - dVar2 * pFVar7->val_) *
         *pdVar9 + ((this->right_->fadexpr_).left_.constant_ + pFVar8->val_) *
                   (-*pdVar10 * dVar1 - *pdVar11 * dVar2);
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}